

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall
Memory::Recycler::TryMarkArenaMemoryBlockList(Recycler *this,ArenaMemoryBlock *memoryBlocks)

{
  void **obj;
  size_t byteCount;
  void **base;
  ArenaMemoryBlock *blockp;
  size_t scanRootBytes;
  ArenaMemoryBlock *memoryBlocks_local;
  Recycler *this_local;
  
  blockp = (ArenaMemoryBlock *)0x0;
  for (base = (void **)memoryBlocks; base != (void **)0x0; base = (void **)*base) {
    obj = (void **)ArenaMemoryBlock::GetBytes((ArenaMemoryBlock *)base);
    blockp = (ArenaMemoryBlock *)((long)base[1] + (long)blockp);
    ScanMemory<false>(this,obj,(size_t)base[1]);
  }
  return (size_t)blockp;
}

Assistant:

size_t
Recycler::TryMarkArenaMemoryBlockList(ArenaMemoryBlock * memoryBlocks)
{
    size_t scanRootBytes = 0;
    ArenaMemoryBlock *blockp = memoryBlocks;
    while (blockp != NULL)
    {
        void** base=(void**)blockp->GetBytes();
        size_t byteCount = blockp->nbytes;
        scanRootBytes += byteCount;
        this->ScanMemory<false>(base, byteCount);
        blockp = blockp->next;
    }
    return scanRootBytes;
}